

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O1

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  float fVar1;
  Pixel *pPVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  float *__result;
  float *pfVar6;
  long lVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  float fVar14;
  float fVar15;
  RGB RVar16;
  undefined8 local_30;
  float local_28;
  SampledSpectrum local_20;
  
  auVar13._8_56_ = L._16_56_;
  auVar13._0_8_ = L.values.values._8_8_;
  auVar10._8_56_ = L._8_56_;
  auVar10._0_8_ = L.values.values._0_8_;
  local_20.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
  auVar12 = ZEXT856(local_20.values.values._8_8_);
  RVar16 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&local_20,lambda);
  local_28 = RVar16.b;
  auVar11._0_8_ = RVar16._0_8_;
  auVar11._8_56_ = auVar12;
  pfVar6 = (float *)&local_30;
  auVar9 = auVar11._0_16_;
  local_30 = vmovlps_avx(auVar9);
  lVar7 = 4;
  do {
    if (*pfVar6 < *(float *)((long)&local_30 + lVar7)) {
      pfVar6 = (float *)((long)&local_30 + lVar7);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  fVar14 = *pfVar6;
  fVar1 = this->maxComponentValue;
  fVar15 = fVar1 / fVar14;
  if (fVar1 < fVar14) {
    auVar9._0_4_ = RVar16.r * fVar15;
    auVar9._4_4_ = RVar16.g * fVar15;
    auVar9._8_4_ = auVar12._0_4_ * fVar15;
    auVar9._12_4_ = auVar12._4_4_ * fVar15;
  }
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar14),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  iVar8 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar8 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar8) *
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).x - iVar8);
  pPVar2 = (this->pixels).values;
  auVar3 = vmovshdup_avx(auVar9);
  lVar7 = 0;
  do {
    fVar14 = auVar9._0_4_;
    if (((int)lVar7 != 0) && (fVar14 = auVar3._0_4_, (int)lVar7 != 1)) {
      fVar14 = (float)((uint)bVar5 * (int)(local_28 * fVar15) + (uint)!bVar5 * (int)local_28);
    }
    pPVar2[iVar8].rgbSum[lVar7] = (double)(fVar14 * weight) + pPVar2[iVar8].rgbSum[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  pPVar2[iVar8].weightSum = (double)weight + pPVar2[iVar8].weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        RGB rgb = sensor->ToSensorRGB(L, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }